

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

uint __thiscall CScript::GetSigOpCount(CScript *this,CScript *scriptSig)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  CScript *pCVar4;
  const_iterator end;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  const_iterator pc;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  const_iterator local_50;
  direct_or_indirect local_48;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (this->super_CScriptBase)._size;
  uVar2 = uVar3 - 0x1d;
  if (uVar3 < 0x1d) {
    uVar2 = uVar3;
  }
  if (uVar2 == 0x17) {
    pCVar4 = this;
    if (0x1c < uVar3) {
      pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if ((((pCVar4->super_CScriptBase)._union.direct[0] == -0x57) &&
        ((pCVar4->super_CScriptBase)._union.direct[1] == '\x14')) &&
       ((pCVar4->super_CScriptBase)._union.direct[0x16] == -0x79)) {
      local_50.ptr = (uchar *)scriptSig;
      if (0x1c < (scriptSig->super_CScriptBase)._size) {
        local_50.ptr = (uchar *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
      }
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (uchar *)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        uVar3 = (scriptSig->super_CScriptBase)._size;
        uVar2 = uVar3 - 0x1d;
        if (uVar3 < 0x1d) {
          uVar2 = uVar3;
        }
        pCVar4 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar3 < 0x1d) {
          pCVar4 = scriptSig;
        }
        end.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar2);
        if (end.ptr <= local_50.ptr) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents
                     ,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          uVar3 = GetSigOpCount((CScript *)&local_48.indirect_contents,true);
          if (0x1c < local_2c) {
            free((void *)CONCAT44(local_48._4_4_,local_48._0_4_));
          }
          goto LAB_00427adf;
        }
        bVar1 = GetScriptOp(&local_50,end,(opcodetype *)local_48.direct,&local_68);
      } while ((bVar1) && ((int)local_48._0_4_ < 0x61));
      uVar3 = 0;
LAB_00427adf:
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return uVar3;
      }
      goto LAB_00427b68;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar3 = GetSigOpCount(this,true);
    return uVar3;
  }
LAB_00427b68:
  __stack_chk_fail();
}

Assistant:

unsigned int CScript::GetSigOpCount(const CScript& scriptSig) const
{
    if (!IsPayToScriptHash())
        return GetSigOpCount(true);

    // This is a pay-to-script-hash scriptPubKey;
    // get the last item that the scriptSig
    // pushes onto the stack:
    const_iterator pc = scriptSig.begin();
    std::vector<unsigned char> vData;
    while (pc < scriptSig.end())
    {
        opcodetype opcode;
        if (!scriptSig.GetOp(pc, opcode, vData))
            return 0;
        if (opcode > OP_16)
            return 0;
    }

    /// ... and return its opcount:
    CScript subscript(vData.begin(), vData.end());
    return subscript.GetSigOpCount(true);
}